

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Option::run_callback(Option *this)

{
  bool bVar1;
  undefined8 uVar2;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  string *in_stack_00000028;
  ConversionError *in_stack_00000030;
  bool local_result;
  results_t *send_results;
  results_t *in_stack_000000a8;
  bool used_default_str;
  results_t *in_stack_00000150;
  results_t *in_stack_00000158;
  Option *in_stack_00000160;
  undefined1 in_stack_00000296;
  undefined1 in_stack_00000297;
  Option *in_stack_00000298;
  string *in_stack_ffffffffffffff48;
  Option *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  string local_30 [39];
  byte local_9;
  
  local_9 = 0;
  if (((*(byte *)(in_RDI + 0x24e) & 1) != 0) &&
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffff60), bVar1)) {
    local_9 = 1;
    in_stack_ffffffffffffff60 = local_30;
    ::std::__cxx11::string::string(in_stack_ffffffffffffff60,(string *)(in_RDI + 0xe8));
    add_result(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ::std::__cxx11::string::~string(local_30);
  }
  if (*(char *)(in_RDI + 0x248) == '\0') {
    _validate_results(this,in_stack_000000a8);
    *(undefined1 *)(in_RDI + 0x248) = 2;
  }
  if (*(char *)(in_RDI + 0x248) < '\x04') {
    _reduce_results(in_stack_00000160,in_stack_00000158,in_stack_00000150);
  }
  *(undefined1 *)(in_RDI + 0x248) = 6;
  bVar1 = ::std::function::operator_cast_to_bool
                    ((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                      *)0x174173);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff60);
    bVar1 = std::
            function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
            ::operator()((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                          *)in_stack_ffffffffffffff50,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffff48);
    if ((local_9 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x1741f6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x174207);
    }
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(in_stack_00000298,(bool)in_stack_00000297,(bool)in_stack_00000296);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      ConversionError::ConversionError(in_stack_00000030,in_stack_00000028,in_stack_00000020);
      __cxa_throw(uVar2,&ConversionError::typeinfo,ConversionError::~ConversionError);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void Option::run_callback() {
    bool used_default_str = false;
    if(force_callback_ && results_.empty()) {
        used_default_str = true;
        add_result(default_str_);
    }
    if(current_option_state_ == option_state::parsing) {
        _validate_results(results_);
        current_option_state_ = option_state::validated;
    }

    if(current_option_state_ < option_state::reduced) {
        _reduce_results(proc_results_, results_);
    }

    current_option_state_ = option_state::callback_run;
    if(callback_) {
        const results_t &send_results = proc_results_.empty() ? results_ : proc_results_;
        bool local_result = callback_(send_results);
        if(used_default_str) {
            // we only clear the results if the callback was actually used
            // otherwise the callback is the storage of the default
            results_.clear();
            proc_results_.clear();
        }
        if(!local_result)
            throw ConversionError(get_name(), results_);
    }
}